

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemory.c
# Opt level: O2

float * floatCalloc(size_t n)

{
  float *pfVar1;
  size_t sVar2;
  char msg [256];
  char acStack_118 [256];
  
  pfVar1 = (float *)superlu_malloc(n * 4);
  if (pfVar1 == (float *)0x0) {
    sprintf(acStack_118,"%s at line %d in file %s\n",
            "SUPERLU_MALLOC failed for buf in floatCalloc()\n",0x2c2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/smemory.c");
    superlu_abort_and_exit(acStack_118);
  }
  for (sVar2 = 0; n != sVar2; sVar2 = sVar2 + 1) {
    pfVar1[sVar2] = 0.0;
  }
  return pfVar1;
}

Assistant:

float *floatCalloc(size_t n)
{
    float *buf;
    register size_t i;
    float zero = 0.0;
    buf = (float *) SUPERLU_MALLOC(n * (size_t) sizeof(float));
    if ( !buf ) {
	ABORT("SUPERLU_MALLOC failed for buf in floatCalloc()\n");
    }
    for (i = 0; i < n; ++i) buf[i] = zero;
    return (buf);
}